

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O3

void __thiscall
cppcms::http::context::context(context *this,shared_ptr<cppcms::impl::cgi::connection> *conn)

{
  hold_ptr<cppcms::http::context::_data> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _data *p_Var2;
  response *this_01;
  service *this_02;
  manager *this_03;
  string local_40;
  
  (this->super_enable_shared_from_this<cppcms::http::context>)._M_weak_this.
  super___weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppcms::http::context>)._M_weak_this.
  super___weak_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->d).ptr_ = (_data *)0x0;
  (this->conn_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (conn->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  p_Var1 = (conn->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->conn_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00 = &this->d;
  p_Var2 = (_data *)operator_new(0x150);
  _data::_data(p_Var2,this);
  booster::hold_ptr<cppcms::http::context::_data>::reset(this_00,p_Var2);
  p_Var2 = this_00->ptr_;
  this_01 = (response *)operator_new(0x20);
  http::response::response(this_01,this);
  std::__uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>::reset
            ((__uniq_ptr_impl<cppcms::http::response,_std::default_delete<cppcms::http::response>_>
              *)&p_Var2->response,this_01);
  this_02 = cppcms::impl::cgi::connection::service
                      ((this->conn_).
                       super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
  this_03 = cppcms::service::views_pool(this_02);
  views::manager::default_skin_abi_cxx11_(&local_40,this_03);
  std::__cxx11::string::_M_assign((string *)&this_00->ptr_->skin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

context::context(booster::shared_ptr<impl::cgi::connection> conn) :
	conn_(conn)
{
	d.reset(new _data(*this));
	d->response.reset(new http::response(*this));
	skin(service().views_pool().default_skin());
}